

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_java_struct_tuple_scheme
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string sStack_48;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"private static class ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,
                           "TupleSchemeFactory implements org.apache.thrift.scheme.SchemeFactory {")
  ;
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"public ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  poVar3 = std::operator<<(poVar3,"TupleScheme getScheme() {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"return new ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
  poVar3 = std::operator<<(poVar3,"TupleScheme();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_48);
  poVar3 = std::operator<<(poVar3,"private static class ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar2));
  poVar3 = std::operator<<(poVar3,"TupleScheme extends org.apache.thrift.scheme.TupleScheme<");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_03,iVar2));
  poVar3 = std::operator<<(poVar3,"> {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_48);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  generate_java_struct_tuple_writer(this,out,tstruct);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  generate_java_struct_tuple_reader(this,out,tstruct);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&sStack_48,(t_generator *)this);
  poVar3 = std::operator<<(out,(string *)&sStack_48);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_48);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_scheme(ostream& out, t_struct* tstruct) {
  indent(out) << "private static class " << tstruct->get_name()
              << "TupleSchemeFactory implements org.apache.thrift.scheme.SchemeFactory {" << endl;
  indent_up();
  indent(out) << "public " << tstruct->get_name() << "TupleScheme getScheme() {" << endl;
  indent_up();
  indent(out) << "return new " << tstruct->get_name() << "TupleScheme();" << endl;
  indent_down();
  indent(out) << "}" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
  out << indent() << "private static class " << tstruct->get_name()
      << "TupleScheme extends org.apache.thrift.scheme.TupleScheme<" << tstruct->get_name() << "> {" << endl << endl;
  indent_up();
  generate_java_struct_tuple_writer(out, tstruct);
  out << endl;
  generate_java_struct_tuple_reader(out, tstruct);
  indent_down();
  out << indent() << "}" << endl << endl;
}